

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O1

void cplus::lang::ByteArray::binToString(char value,char *buffer)

{
  buffer[7] = value & 1U | 0x30;
  buffer[6] = (value & 2U) == 0 ^ 0x31;
  buffer[5] = (value & 4U) == 0 ^ 0x31;
  buffer[4] = (value & 8U) == 0 ^ 0x31;
  buffer[3] = (value & 0x10U) == 0 ^ 0x31;
  buffer[2] = (value & 0x20U) == 0 ^ 0x31;
  buffer[1] = (value & 0x40U) == 0 ^ 0x31;
  *buffer = (byte)~value >> 7 ^ 0x31;
  return;
}

Assistant:

void ByteArray::binToString(char value, char *buffer) {
			buffer[7] = ((value & 0x1) == 0 ? '0' : '1');
			buffer[6] = ((value & 0x2) == 0 ? '0' : '1');
			buffer[5] = ((value & 0x4) == 0 ? '0' : '1');
			buffer[4] = ((value & 0x8) == 0 ? '0' : '1');
			buffer[3] = ((value & 0x10) == 0 ? '0' : '1');
			buffer[2] = ((value & 0x20) == 0 ? '0' : '1');
			buffer[1] = ((value & 0x40) == 0 ? '0' : '1');
			buffer[0] = ((value & 0x80) == 0 ? '0' : '1');
		}